

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall reader_authority_suite::test_host_port::test_method(test_host_port *this)

{
  bool bVar1;
  uint local_1b0;
  value local_1ac;
  view_type local_1a8;
  undefined8 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  authority reader;
  char input [11];
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1a8.ptr_ = input;
  builtin_strncpy(input,"1.2.3.4:80",0xb);
  local_1a8.len_ = strlen(local_1a8.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_1a8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2b);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_1ac = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_1b0 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_1a8,&local_60,0x2b,2,2,&local_1ac,"reader.code()",&local_1b0,
             "url::token::code::authority_host");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2c);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[8]>
            (&local_1a8,&local_90,0x2c,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1.2.3.4","\"1.2.3.4\"");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2d);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_170 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next(&reader);
  local_1ac = CONCAT31(local_1ac._1_3_,bVar1);
  local_1b0 = CONCAT31(local_1b0._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_1a8,&local_178,0x2d,2,2,&local_1ac,"reader.next()",&local_1b0,"true");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x2e);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d8 = "";
  local_1ac = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_1b0 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_1a8,&local_e0,0x2e,2,2,&local_1ac,"reader.code()",&local_1b0,
             "url::token::code::authority_port");
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x2f);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_108 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[3]>
            (&local_1a8,&local_110,0x2f,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","80","\"80\"");
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_118 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x30);
  local_1a8.len_ = local_1a8.len_ & 0xffffffffffffff00;
  local_1a8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_180 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next(&reader);
  local_1ac = CONCAT31(local_1ac._1_3_,bVar1);
  local_1b0 = local_1b0 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_1a8,&local_188,0x30,2,2,&local_1ac,"reader.next()",&local_1b0,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_host_port)
{
    const char input[] = "1.2.3.4:80";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1.2.3.4");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_port);
    BOOST_REQUIRE_EQUAL(reader.literal(), "80");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}